

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

bool image_match::has_supported_extension(path *ext)

{
  source_loc loc;
  logger *this;
  const_iterator pvVar1;
  const_iterator __last;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  string local_88;
  string local_58;
  string_view_t local_38;
  source_loc local_28;
  path *local_10;
  path *ext_local;
  
  local_10 = (path *)ext;
  this = spdlog::default_logger_raw();
  spdlog::source_loc::source_loc
            (&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/src/image.cpp"
             ,0x6c,"has_supported_extension");
  ::fmt::v7::basic_string_view<char>::basic_string_view(&local_38,"Checking extension {}");
  CLI::std::filesystem::__cxx11::path::string(&local_58,local_10);
  loc.line = local_28.line;
  loc._12_4_ = local_28._12_4_;
  loc.filename = local_28.filename;
  loc.funcname = local_28.funcname;
  spdlog::logger::log<std::__cxx11::string>(this,loc,debug,local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  pvVar1 = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
           ::begin((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                    *)SUPPORTED_IMAGE_EXTENSIONS_abi_cxx11_);
  __last = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
           ::end((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                  *)SUPPORTED_IMAGE_EXTENSIONS_abi_cxx11_);
  CLI::std::filesystem::__cxx11::path::string(&local_88,local_10);
  pbVar2 = std::find<std::__cxx11::string_const*,std::__cxx11::string>
                     (pvVar1,__last,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88
                     );
  pvVar1 = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
           ::end((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                  *)SUPPORTED_IMAGE_EXTENSIONS_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_88);
  return pbVar2 != pvVar1;
}

Assistant:

bool
has_supported_extension(const std::filesystem::path& ext)
{
    SPDLOG_DEBUG("Checking extension {}", ext.string());

    return std::find(SUPPORTED_IMAGE_EXTENSIONS.begin(),
                     SUPPORTED_IMAGE_EXTENSIONS.end(),
                     ext.string()) != SUPPORTED_IMAGE_EXTENSIONS.end();
}